

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_png_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  int r;
  int n;
  png p;
  FILE *f_local;
  
  p.out = (uint8 *)f;
  lVar2 = ftell((FILE *)f);
  start_file((stbi *)&r,(FILE *)p.out);
  iVar1 = parse_png_file((png *)&r,1,0);
  fseek((FILE *)p.out,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int stbi_png_test_file(FILE *f)
{
   png p;
   int n,r;
   n = ftell(f);
   start_file(&p.s, f);
   r = parse_png_file(&p, SCAN_type,STBI_default);
   fseek(f,n,SEEK_SET);
   return r;
}